

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O3

int Abc_NodeEvalMvCost(int nVars,Vec_Int_t *vSop0,Vec_Int_t *vSop1)

{
  char *__ptr;
  char *pcVar1;
  char cVar2;
  int iVar3;
  
  __ptr = Abc_NodeConvertSopToMvSop(nVars,vSop0,vSop1);
  cVar2 = *__ptr;
  if (cVar2 == '\0') {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    pcVar1 = __ptr;
    do {
      pcVar1 = pcVar1 + 1;
      iVar3 = iVar3 + (uint)(cVar2 == '\n');
      cVar2 = *pcVar1;
    } while (cVar2 != '\0');
  }
  free(__ptr);
  return iVar3;
}

Assistant:

int Abc_NodeEvalMvCost( int nVars, Vec_Int_t * vSop0, Vec_Int_t * vSop1 ) 
{
    char * pMvSop;
    int * pVarValues;
    int i, RetValue;
    // collect the input and output values (currently, they are binary)
    pVarValues = ABC_ALLOC( int, nVars + 1 );
    for ( i = 0; i <= nVars; i++ )
        pVarValues[i] = 2;
    // prepare MV-SOP for evaluation
    pMvSop = Abc_NodeConvertSopToMvSop( nVars, vSop0, vSop1 );
    // have a look at the MV-SOP:
//    printf( "%s\n", pMvSop );
    // get the result of internal cost evaluation
    RetValue = Abc_NodeEvalMvCostInternal( nVars, pVarValues, pMvSop );
    // cleanup
    ABC_FREE( pVarValues );
    ABC_FREE( pMvSop );
    return RetValue;
}